

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int anon_unknown.dwarf_17824::SMPI_Allgatherv_Impl<int>
              (int *sendbuf,int sendcount,void *recvbuf,size_t *recvcounts,size_t *displs,
              SMPI_Datatype recvtype,SMPI_Comm comm)

{
  unsigned_long *recvbuf_00;
  int *in_RCX;
  size_t in_RDX;
  int in_ESI;
  string *in_RDI;
  Comm *in_R8;
  undefined4 in_R9D;
  size_t *in_stack_00000008;
  size_t *in_stack_fffffffffffffe40;
  size_t *in_stack_fffffffffffffe48;
  long *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  Comm *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe80;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [80];
  
  switch(in_R9D) {
  case 0:
    std::__cxx11::string::string(local_50);
    adios2::helper::Comm::Allgatherv<int,int>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (int *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_50);
    break;
  case 1:
    std::__cxx11::string::string(local_a0);
    adios2::helper::Comm::Allgatherv<int,long>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_RDI)
    ;
    std::__cxx11::string::~string(local_a0);
    break;
  case 2:
    recvbuf_00 = (unsigned_long *)(long)in_ESI;
    std::__cxx11::string::string(local_c0);
    adios2::helper::Comm::Allgatherv<int,unsigned_long>
              (in_R8,in_RCX,in_RDX,recvbuf_00,(size_t *)in_RDI,in_stack_00000008,
               in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_c0);
    break;
  case 3:
    std::__cxx11::string::string(local_80);
    adios2::helper::Comm::Allgatherv<int,char>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
               ,in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_80);
    break;
  case 4:
    std::__cxx11::string::string(local_e0);
    adios2::helper::Comm::Allgatherv<int,unsigned_char>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (uchar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_e0);
  }
  return 0;
}

Assistant:

int SMPI_Allgatherv_Impl(const TSend *sendbuf, int sendcount, void *recvbuf,
                         const size_t *recvcounts, const size_t *displs, SMPI_Datatype recvtype,
                         SMPI_Comm comm)
{
    switch (recvtype)
    {
#define F(type)                                                                                    \
    comm->Allgatherv(sendbuf, sendcount, static_cast<type *>(recvbuf), recvcounts, displs)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}